

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O0

int ngram_ord_comparator(void *a_raw,void *b_raw)

{
  bool bVar1;
  uint local_38;
  uint local_34;
  int b_w_ptr;
  int a_w_ptr;
  ngram_raw_t *b;
  ngram_raw_t *a;
  void *b_raw_local;
  void *a_raw_local;
  
  local_34 = 0;
  local_38 = 0;
  while( true ) {
    bVar1 = false;
    if (local_34 < *(uint *)((long)a_raw + 0x10)) {
      bVar1 = local_38 < *(uint *)((long)b_raw + 0x10);
    }
    if (!bVar1) break;
    if (*(int *)(*a_raw + (long)(int)local_34 * 4) != *(int *)(*b_raw + (long)(int)local_38 * 4)) {
      if (*(uint *)(*a_raw + (long)(int)local_34 * 4) < *(uint *)(*b_raw + (long)(int)local_38 * 4))
      {
        a_raw_local._4_4_ = -1;
      }
      else {
        a_raw_local._4_4_ = 1;
      }
      return a_raw_local._4_4_;
    }
    local_34 = local_34 + 1;
    local_38 = local_38 + 1;
  }
  return *(int *)((long)a_raw + 0x10) - *(int *)((long)b_raw + 0x10);
}

Assistant:

int
ngram_ord_comparator(const void *a_raw, const void *b_raw)
{
    ngram_raw_t *a = (ngram_raw_t *) a_raw;
    ngram_raw_t *b = (ngram_raw_t *) b_raw;
    int a_w_ptr = 0;
    int b_w_ptr = 0;
    while ((uint32)a_w_ptr < a->order && (uint32)b_w_ptr < b->order) {
        if (a->words[a_w_ptr] == b->words[b_w_ptr]) {
            a_w_ptr++;
            b_w_ptr++;
            continue;
        }
        if (a->words[a_w_ptr] < b->words[b_w_ptr])
            return -1;
        else
            return 1;
    }
    return a->order - b->order;
}